

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_24939c::LocalName::printLeft(LocalName *this,OutputStream *S)

{
  StringView local_28;
  OutputStream *local_18;
  OutputStream *S_local;
  LocalName *this_local;
  
  local_18 = S;
  S_local = (OutputStream *)this;
  Node::print(this->Encoding,S);
  StringView::StringView(&local_28,"::");
  OutputStream::operator+=(local_18,local_28);
  Node::print(this->Entity,local_18);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    Encoding->print(S);
    S += "::";
    Entity->print(S);
  }